

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int port;
  int max_connection;
  ostream *this;
  allocator local_2031;
  string local_2030;
  undefined1 local_2010 [8];
  CFtpTransfer t;
  char **argv_local;
  int argc_local;
  
  t._8176_8_ = argv;
  if (argc == 4) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2030,pcVar1,&local_2031);
    port = atoi(*(char **)(t._8176_8_ + 0x10));
    max_connection = atoi(*(char **)(t._8176_8_ + 0x18));
    CFtpTransfer::CFtpTransfer((CFtpTransfer *)local_2010,&local_2030,port,max_connection);
    std::__cxx11::string::~string((string *)&local_2030);
    std::allocator<char>::~allocator((allocator<char> *)&local_2031);
    CTransfer::run((CTransfer *)local_2010);
    argv_local._4_4_ = 0;
    CFtpTransfer::~CFtpTransfer((CFtpTransfer *)local_2010);
  }
  else {
    this = std::operator<<((ostream *)&std::cout,
                           "Please user SimpleFtpServer [ip] [port] [max_connection] to execute this program."
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc,char **argv) {
#ifndef _DEBUG
    if(argc != 4){
        cout << "Please user SimpleFtpServer [ip] [port] [max_connection] to execute this program." << endl;
        return -1;
    }
    CFtpTransfer t(argv[1],atoi(argv[2]),atoi(argv[3]));
#else
    CFtpTransfer t("0.0.0.0",5000,2);
#endif
    t.run();
    return 0;
}